

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

plain_iterator * __thiscall dg::vr::ValueRelations::begin(ValueRelations *this)

{
  PlainValueIterator *in_RSI;
  BucketIterator in_RDI;
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  *in_stack_ffffffffffffffc8;
  BucketIterator b;
  
  b._M_node = in_RDI._M_node;
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  ::begin(in_stack_ffffffffffffffc8);
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  ::end(in_stack_ffffffffffffffc8);
  PlainValueIterator::PlainValueIterator(in_RSI,b,in_RDI);
  return (plain_iterator *)b._M_node;
}

Assistant:

ValueRelations::plain_iterator ValueRelations::begin() const {
    return {bucketToVals.begin(), bucketToVals.end()};
}